

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void xmlIconvFree(void *vctxt)

{
  if (vctxt != (void *)0x0) {
    if (*vctxt != (iconv_t)0xffffffffffffffff) {
      iconv_close(*vctxt);
    }
    (*xmlFree)(vctxt);
    return;
  }
  return;
}

Assistant:

static void
xmlIconvFree(void *vctxt) {
    xmlIconvCtxt *ctxt = vctxt;

    if (ctxt == NULL)
        return;

    if (ctxt->cd != (iconv_t) -1)
        iconv_close(ctxt->cd);

    xmlFree(ctxt);
}